

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

AActor * P_RoughMonsterSearch(AActor *mo,int distance,bool onlyseekable,bool frontonly)

{
  Angle *this;
  double dVar1;
  double dVar2;
  AActor *pAVar3;
  undefined7 in_register_00000009;
  undefined4 local_58;
  uint uStack_54;
  undefined1 local_40;
  undefined1 local_3f;
  double local_38;
  double dStack_30;
  undefined4 local_28;
  uint uStack_24;
  undefined4 uStack_20;
  uint uStack_1c;
  
  local_40 = onlyseekable;
  local_3f = frontonly;
  if ((int)CONCAT71(in_register_00000009,frontonly) != 0) {
    local_38 = (mo->__Pos).X;
    dStack_30 = (mo->__Pos).Y;
    this = &(mo->Angles).Yaw;
    dVar1 = TAngle<double>::Sin(this);
    dVar2 = TAngle<double>::Cos(this);
    local_58 = SUB84(dVar1,0);
    uStack_54 = (uint)((ulong)dVar1 >> 0x20);
    uStack_20 = SUB84(dVar2,0);
    uStack_24 = uStack_54 ^ 0x80000000;
    uStack_1c = (uint)((ulong)dVar2 >> 0x20) ^ 0x80000000;
    local_28 = local_58;
  }
  pAVar3 = P_BlockmapSearch(mo,distance,RoughBlockCheck,&local_40);
  return pAVar3;
}

Assistant:

AActor *P_RoughMonsterSearch(AActor *mo, int distance, bool onlyseekable, bool frontonly)
{
	BlockCheckInfo info;
	info.onlyseekable = onlyseekable;
	if ((info.frontonly = frontonly))
	{
		info.frontline.x = mo->X();
		info.frontline.y = mo->Y();
		info.frontline.dx = -mo->Angles.Yaw.Sin();
		info.frontline.dy = -mo->Angles.Yaw.Cos();
	}

	return P_BlockmapSearch(mo, distance, RoughBlockCheck, (void *)&info);
}